

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMap.c
# Opt level: O3

void Cnf_DeriveMapping(Cnf_Man_t *p)

{
  int iVar1;
  ulong uVar2;
  int *pAreaFlows;
  undefined8 *__ptr;
  void *pvVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  Dar_Cut_t *pDVar6;
  Dar_Cut_t *pCut;
  long lVar7;
  
  pVVar5 = p->pManAig->vObjs;
  iVar1 = pVVar5->nSize;
  pAreaFlows = (int *)calloc(1,(long)iVar1 * 4);
  __ptr = (undefined8 *)malloc(0x10);
  *__ptr = 100;
  pvVar3 = malloc(800);
  __ptr[1] = pvVar3;
  if (0 < (long)iVar1) {
    lVar7 = 0;
    do {
      pvVar3 = pVVar5->pArray[lVar7];
      if ((pvVar3 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7)) {
        pCut = *(Dar_Cut_t **)((long)pvVar3 + 0x28);
        uVar4 = 0;
        pDVar6 = (Dar_Cut_t *)0x0;
        do {
          if ((((*(uint *)&pCut->field_0x4 >> 0x1c & 1) != 0) &&
              (*(uint *)&pCut->field_0x4 = *(uint *)&pCut->field_0x4 & 0xf7ffffff, uVar4 != 0)) &&
             (((Cnf_CutAssignAreaFlow(p,pCut,pAreaFlows), pDVar6 == (Dar_Cut_t *)0x0 ||
               (pCut->uSign < pDVar6->uSign)) ||
              ((pDVar6->uSign == pCut->uSign &&
               ((*(ushort *)&pDVar6->field_0x6 & 0x7ff) < (*(ushort *)&pCut->field_0x6 & 0x7ff))))))
             ) {
            pDVar6 = pCut;
          }
          uVar4 = uVar4 + 1;
          pCut = pCut + 1;
          uVar2 = *(ulong *)((long)pvVar3 + 0x18);
        } while (uVar4 < (byte)(uVar2 >> 0x38));
        if ((int)pDVar6->uSign < 0x3b9aca01) {
          pAreaFlows[*(int *)((long)pvVar3 + 0x24)] = pDVar6->uSign;
          pDVar6->field_0x7 = pDVar6->field_0x7 | 8;
        }
        else {
          pAreaFlows[*(int *)((long)pvVar3 + 0x24)] = 1000000000;
          *(ulong *)((long)pvVar3 + 0x18) = uVar2 | 0x20;
        }
      }
      lVar7 = lVar7 + 1;
      pVVar5 = p->pManAig->vObjs;
    } while (lVar7 < pVVar5->nSize);
    pvVar3 = (void *)__ptr[1];
  }
  if (pvVar3 != (void *)0x0) {
    free(pvVar3);
  }
  free(__ptr);
  if (pAreaFlows == (int *)0x0) {
    return;
  }
  free(pAreaFlows);
  return;
}

Assistant:

void Cnf_DeriveMapping( Cnf_Man_t * p )
{
    Vec_Ptr_t * vSuper;
    Aig_Obj_t * pObj;
    Dar_Cut_t * pCut, * pCutBest;
    int i, k, AreaFlow, * pAreaFlows;
    // allocate area flows
    pAreaFlows = ABC_ALLOC( int, Aig_ManObjNumMax(p->pManAig) );
    memset( pAreaFlows, 0, sizeof(int) * Aig_ManObjNumMax(p->pManAig) );
    // visit the nodes in the topological order and update their best cuts
    vSuper = Vec_PtrAlloc( 100 );
    Aig_ManForEachNode( p->pManAig, pObj, i )
    {
        // go through the cuts
        pCutBest = NULL;
        Dar_ObjForEachCut( pObj, pCut, k )
        {
            pCut->fBest = 0;
            if ( k == 0 )
                continue;
            Cnf_CutAssignAreaFlow( p, pCut, pAreaFlows );
            if ( pCutBest == NULL || pCutBest->uSign > pCut->uSign || 
                (pCutBest->uSign == pCut->uSign && pCutBest->Value < pCut->Value) )
                 pCutBest = pCut;
        }
        // check the big cut
//        Aig_ObjCollectSuper( pObj, vSuper );
        // get the area flow of this cut
//        AreaFlow = Cnf_CutSuperAreaFlow( vSuper, pAreaFlows );
        AreaFlow = ABC_INFINITY;
        if ( AreaFlow >= (int)pCutBest->uSign )
        {
            pAreaFlows[pObj->Id] = pCutBest->uSign;
            pCutBest->fBest = 1;
        }
        else
        {
            pAreaFlows[pObj->Id] = AreaFlow;
            pObj->fMarkB = 1; // mark the special node
        }
    }
    Vec_PtrFree( vSuper );
    ABC_FREE( pAreaFlows );

/*
    // compute the area of mapping
    AreaFlow = 0;
    Aig_ManForEachCo( p->pManAig, pObj, i )
        AreaFlow += Dar_ObjBestCut(Aig_ObjFanin0(pObj))->uSign / 100 / Aig_ObjFanin0(pObj)->nRefs;
    printf( "Area of the network = %d.\n", AreaFlow );
*/
}